

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O1

void __thiscall absl::SetLogBacktraceLocation(absl *this,string_view file,int line)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  MixingHashState MVar3;
  uint32_t least_significant;
  uint64_t v;
  
  MVar3 = hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)0x194da0,(uchar *)file._M_len,(size_t)this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this + MVar3.state_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)(uint)file._M_str;
  _ZN4absl12_GLOBAL__N_121log_backtrace_at_hashE_0 =
       SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
       SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0);
  return;
}

Assistant:

void SetLogBacktraceLocation(absl::string_view file, int line) {
  log_backtrace_at_hash.store(HashSiteForLogBacktraceAt(file, line),
                              std::memory_order_relaxed);
}